

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVector.cpp
# Opt level: O0

void __thiscall AlphaVector::IAdd(AlphaVector *this,AlphaVector *B)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  const_reference pvVar5;
  reference pvVar6;
  E *in_RSI;
  long in_RDI;
  Index sI;
  uint local_20;
  char *in_stack_ffffffffffffffe8;
  
  uVar2 = GetNrValues((AlphaVector *)0x903ffd);
  uVar3 = GetNrValues((AlphaVector *)0x90400b);
  if (uVar2 != uVar3) {
    uVar4 = __cxa_allocate_exception(0x28);
    E::E(in_RSI,in_stack_ffffffffffffffe8);
    __cxa_throw(uVar4,&E::typeinfo,E::~E);
  }
  local_20 = 0;
  while( true ) {
    uVar2 = GetNrValues((AlphaVector *)0x904084);
    if (uVar2 <= local_20) break;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &(in_RSI->_m_error)._M_string_length,(ulong)local_20);
    dVar1 = *pvVar5;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),(ulong)local_20);
    *pvVar6 = dVar1 + *pvVar6;
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void AlphaVector::IAdd(const AlphaVector& B)
{
    if(this->GetNrValues() != B.GetNrValues())
        throw(E("adding AlphaVectors of different size?!"));
    for(Index sI=0; sI < this->GetNrValues(); sI++)
        _m_values[sI] += B._m_values[sI];
}